

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O2

void __thiscall PrintfTest_OStream_Test::TestBody(PrintfTest_OStream_Test *this)

{
  char *pcVar1;
  AssertHelper local_1c0;
  AssertionResult gtest_ar;
  int ret;
  AssertionResult gtest_ar_1;
  ostringstream os;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  ret = fmt::v5::fprintf<char[10],char[6]>
                  ((basic_ostream<char,_std::char_traits<char>_> *)&os,(char (*) [10])"Don\'t %s!",
                   (char (*) [6])"panic");
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[13],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"Don\'t panic!\"","os.str()",(char (*) [13])"Don\'t panic!",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1fe,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar_1,"12","ret",(int *)&gtest_ar,&ret);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/printf-test.cc"
               ,0x1ff,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  return;
}

Assistant:

TEST(PrintfTest, OStream) {
  std::ostringstream os;
  int ret = fmt::fprintf(os, "Don't %s!", "panic");
  EXPECT_EQ("Don't panic!", os.str());
  EXPECT_EQ(12, ret);
}